

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_item_reserve.c
# Opt level: O0

mpt_config_item * mpt_config_item_reserve(mpt_array *arr,mpt_path *path)

{
  char *pcVar1;
  size_t sVar2;
  long *plVar3;
  int len_00;
  int iVar4;
  mpt_type_traits *pmVar5;
  int *piVar6;
  mpt_config_item *pmVar7;
  mpt_buffer *pmVar8;
  void *pvVar9;
  mpt_buffer *sub;
  mpt_metatype *old;
  mpt_buffer *b;
  ulong uStack_50;
  int len;
  size_t item_count;
  char *name;
  mpt_config_item *unused;
  mpt_config_item *item;
  mpt_buffer *buf;
  mpt_type_traits *traits;
  mpt_path *path_local;
  mpt_array *arr_local;
  
  uStack_50 = 0;
  pcVar1 = path->base;
  sVar2 = path->off;
  len_00 = mpt_path_next(path);
  if (len_00 < 0) {
    return (mpt_config_item *)0x0;
  }
  pmVar5 = mpt_config_item_traits();
  pmVar8 = arr->_buf;
  if (pmVar8 != (mpt_buffer *)0x0) {
    if (pmVar8->_content_traits != pmVar5) {
      piVar6 = __errno_location();
      *piVar6 = 0x16;
      return (mpt_config_item *)0x0;
    }
    uStack_50 = pmVar8->_used >> 5;
  }
  unused = (mpt_config_item *)(pmVar8 + 1);
  name = (char *)0x0;
  while (uStack_50 != 0) {
    if ((unused->identifier)._len == 0) {
      if (name == (char *)0x0) {
        name = (char *)unused;
      }
      unused = unused + 1;
      uStack_50 = uStack_50 - 1;
    }
    else {
      iVar4 = mpt_identifier_compare(&unused->identifier,pcVar1 + sVar2,len_00);
      if (iVar4 == 0) {
        if (path->len != 0) {
          pmVar7 = mpt_config_item_reserve(&unused->elements,path);
          return pmVar7;
        }
        return unused;
      }
      unused = unused + 1;
      uStack_50 = uStack_50 - 1;
    }
  }
  if (name == (char *)0x0) {
    if (pmVar8 == (mpt_buffer *)0x0) {
      pmVar8 = _mpt_buffer_alloc(0x20,2);
      if (pmVar8 == (mpt_buffer *)0x0) {
        return (mpt_config_item *)0x0;
      }
      name = (char *)(pmVar8 + 1);
      pmVar8->_content_traits = pmVar5;
      pmVar8->_used = 0x20;
      arr->_buf = pmVar8;
    }
    else {
      name = (char *)mpt_array_insert(arr,pmVar8->_used,0x20);
      if (name == (char *)0x0) {
        return (mpt_config_item *)0x0;
      }
    }
    (*pmVar5->init)(name,(void *)0x0);
  }
  else {
    plVar3 = *(long **)(name + 8);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))(plVar3);
      name[8] = '\0';
      name[9] = '\0';
      name[10] = '\0';
      name[0xb] = '\0';
      name[0xc] = '\0';
      name[0xd] = '\0';
      name[0xe] = '\0';
      name[0xf] = '\0';
    }
    if (*(mpt_buffer **)name != (mpt_buffer *)0x0) {
      mpt_buffer_cut(*(mpt_buffer **)name,0,pmVar8->_used);
      mpt_array_reduce((mpt_array *)name);
    }
  }
  pvVar9 = mpt_identifier_set((mpt_identifier *)(name + 0x10),pcVar1 + sVar2,len_00);
  if (pvVar9 == (void *)0x0) {
    arr_local = (mpt_array *)0x0;
  }
  else if (path->len == 0) {
    arr_local = (mpt_array *)name;
  }
  else {
    arr_local = &mpt_config_item_reserve((mpt_array *)name,path)->elements;
  }
  return (mpt_config_item *)arr_local;
}

Assistant:

extern MPT_STRUCT(config_item) *mpt_config_item_reserve(_MPT_UARRAY_TYPE(MPT_STRUCT(config_item)) *arr, MPT_STRUCT(path) *path)
{
	const MPT_STRUCT(type_traits) *traits;
	const MPT_STRUCT(buffer) *buf;
	MPT_STRUCT(config_item) *item, *unused;
	const char *name;
	size_t item_count = 0;
	int len;
	
	name = path->base + path->off;
	if ((len = mpt_path_next(path)) < 0) {
		return 0;
	}
	traits = mpt_config_item_traits();
	if ((buf = arr->_buf)) {
		if (buf->_content_traits != traits) {
			errno = EINVAL;
			return 0;
		}
		item_count = buf->_used / sizeof(*item);
	}
	item = (MPT_STRUCT(config_item) *) (buf + 1);
	unused = 0;
	while (item_count--) {
		if (item->identifier._len == 0) {
			if (!unused) {
				unused = item;
			}
			++item;
			continue;
		}
		if (mpt_identifier_compare(&item->identifier, name, len) != 0) {
			++item;
			continue;
		}
		if (path->len) {
			return mpt_config_item_reserve(&item->elements, path);
		}
		return item;
	}
	if (!unused) {
		/* create initial buffer with unique array flags */
		if (!buf) {
			MPT_STRUCT(buffer) *b;
			if (!(b = _mpt_buffer_alloc(sizeof(*item), MPT_ENUM(BufferNoCopy)))) {
				return 0;
			}
			unused = (MPT_STRUCT(config_item) *) (b + 1);
			b->_content_traits = traits;
			b->_used = sizeof(*item);
			arr->_buf = b;
		}
		else if (!(unused = mpt_array_insert(arr, buf->_used, sizeof(*unused)))) {
			return 0;
		}
		traits->init(unused, 0);
	}
	else {
		MPT_INTERFACE(metatype) *old;
		MPT_STRUCT(buffer) *sub;
		if ((old = unused->value)) {
			old->_vptr->unref(old);
			unused->value = 0;
		}
		if ((sub = unused->elements._buf)) {
			mpt_buffer_cut(sub, 0, buf->_used);
			mpt_array_reduce(&unused->elements);
		}
	}
	if (!mpt_identifier_set(&unused->identifier, name, len)) {
		return 0;
	}
	if (path->len) {
		return mpt_config_item_reserve(&unused->elements, path);
	}
	return unused;
}